

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix2 * matrix2_rotate(matrix2 *self,double angle)

{
  matrix2 *pmVar1;
  undefined1 local_38 [8];
  matrix2 rotationMatrix;
  double angle_local;
  matrix2 *self_local;
  
  rotationMatrix.field_0.m[3] = angle;
  pmVar1 = matrix2_make_transformation_rotationf_z((matrix2 *)local_38,angle);
  pmVar1 = matrix2_multiply(self,pmVar1);
  return pmVar1;
}

Assistant:

HYPAPI struct matrix2 *matrix2_rotate(struct matrix2 *self, HYP_FLOAT angle)
{
	struct matrix2 rotationMatrix;

	return matrix2_multiply(self,
		matrix2_make_transformation_rotationf_z(&rotationMatrix, angle));
}